

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_paged_audio_buffer_read_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_result mVar1;
  ma_paged_audio_buffer_page *pmVar2;
  ma_uint64 mVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *__dest;
  ulong uVar7;
  
  if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (frameCount == 0) {
    uVar7 = 0;
    mVar1 = MA_SUCCESS;
  }
  else {
    pmVar2 = pPagedAudioBuffer->pCurrent;
    uVar6 = (ulong)(*(int *)(&DAT_0019a900 + (ulong)pPagedAudioBuffer->pData->format * 4) *
                   pPagedAudioBuffer->pData->channels);
    mVar3 = pPagedAudioBuffer->relativeCursor;
    uVar7 = 0;
    do {
      mVar4 = pmVar2->sizeInFrames;
      uVar5 = mVar4 - mVar3;
      if (frameCount - uVar7 <= mVar4 - mVar3) {
        uVar5 = frameCount - uVar7;
      }
      __dest = (undefined1 *)(uVar7 * uVar6 + (long)pFramesOut);
      if (__dest != pmVar2->pAudioData + mVar3 * uVar6) {
        memcpy(__dest,pmVar2->pAudioData + mVar3 * uVar6,uVar5 * uVar6);
        pmVar2 = pPagedAudioBuffer->pCurrent;
        mVar3 = pPagedAudioBuffer->relativeCursor;
        mVar4 = pmVar2->sizeInFrames;
      }
      pPagedAudioBuffer->absoluteCursor = pPagedAudioBuffer->absoluteCursor + uVar5;
      uVar7 = uVar7 + uVar5;
      mVar3 = mVar3 + uVar5;
      pPagedAudioBuffer->relativeCursor = mVar3;
      if (mVar3 == mVar4) {
        pmVar2 = pmVar2->pNext;
        if (pmVar2 == (ma_paged_audio_buffer_page *)0x0) {
          mVar1 = MA_AT_END;
          goto LAB_00166f4b;
        }
        pPagedAudioBuffer->pCurrent = pmVar2;
        pPagedAudioBuffer->relativeCursor = 0;
        mVar3 = 0;
      }
    } while (uVar7 < frameCount);
    mVar1 = MA_SUCCESS;
  }
LAB_00166f4b:
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = uVar7;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_read_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesRead = 0;
    ma_format format;
    ma_uint32 channels;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    format   = pPagedAudioBuffer->pData->format;
    channels = pPagedAudioBuffer->pData->channels;

    while (totalFramesRead < frameCount) {
        /* Read from the current page. The buffer should never be in a state where this is NULL. */
        ma_uint64 framesRemainingInCurrentPage;
        ma_uint64 framesRemainingToRead = frameCount - totalFramesRead;
        ma_uint64 framesToReadThisIteration;

        MA_ASSERT(pPagedAudioBuffer->pCurrent != NULL);

        framesRemainingInCurrentPage = pPagedAudioBuffer->pCurrent->sizeInFrames - pPagedAudioBuffer->relativeCursor;

        framesToReadThisIteration = ma_min(framesRemainingInCurrentPage, framesRemainingToRead);
        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), ma_offset_pcm_frames_ptr(pPagedAudioBuffer->pCurrent->pAudioData, pPagedAudioBuffer->relativeCursor, format, channels), framesToReadThisIteration, format, channels);
        totalFramesRead += framesToReadThisIteration;

        pPagedAudioBuffer->absoluteCursor += framesToReadThisIteration;
        pPagedAudioBuffer->relativeCursor += framesToReadThisIteration;

        /* Move to the next page if necessary. If there's no more pages, we need to return MA_AT_END. */
        MA_ASSERT(pPagedAudioBuffer->relativeCursor <= pPagedAudioBuffer->pCurrent->sizeInFrames);

        if (pPagedAudioBuffer->relativeCursor == pPagedAudioBuffer->pCurrent->sizeInFrames) {
            /* We reached the end of the page. Need to move to the next. If there's no more pages, we're done. */
            ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPagedAudioBuffer->pCurrent->pNext);
            if (pNext == NULL) {
                result = MA_AT_END;
                break;  /* We've reached the end. */
            } else {
                pPagedAudioBuffer->pCurrent       = pNext;
                pPagedAudioBuffer->relativeCursor = 0;
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesRead;
    }

    return result;
}